

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

bool __thiscall
helics::PublicationInfo::CheckSetValue
          (PublicationInfo *this,char *dataToCheck,uint64_t len,Time currentTime,
          bool forceChangeCheck)

{
  long lVar1;
  int iVar2;
  byte *st1;
  size_type __rlen;
  
  lVar1 = (this->minTimeGap).internalTimeCode;
  if ((0 < lVar1) &&
     (currentTime.internalTimeCode - (this->lastPublishTime).internalTimeCode < lVar1)) {
    return false;
  }
  if ((forceChangeCheck | this->only_update_on_change) == 1) {
    if ((this->data).bufferSize == len) {
      if (len == 0) {
        return false;
      }
      iVar2 = bcmp(dataToCheck,(this->data).heap,len);
      if (iVar2 == 0) {
        return false;
      }
    }
    SmallBuffer::reserve(&this->data,len);
    (this->data).bufferSize = len;
  }
  else {
    if (this->buffer_data != true) goto LAB_00315041;
    SmallBuffer::reserve(&this->data,len);
    (this->data).bufferSize = len;
  }
  memcpy((this->data).heap,dataToCheck,len);
LAB_00315041:
  (this->lastPublishTime).internalTimeCode = currentTime.internalTimeCode;
  return true;
}

Assistant:

bool PublicationInfo::CheckSetValue(const char* dataToCheck,
                                    uint64_t len,
                                    Time currentTime,
                                    bool forceChangeCheck)
{
    if (minTimeGap > timeZero) {
        if (currentTime - lastPublishTime < minTimeGap) {
            return false;
        }
    }
    if (only_update_on_change || forceChangeCheck) {
        if (std::string_view(dataToCheck, len) != data.to_string()) {
            data.assign(dataToCheck, len);
        } else {
            return false;
        }
    } else if (buffer_data) {
        data.assign(dataToCheck, len);
    }
    lastPublishTime = currentTime;
    return true;
}